

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase168::run(TestCase168 *this)

{
  bool bVar1;
  double *pdVar2;
  float fVar3;
  bool local_1c0d;
  int local_1c0c;
  undefined1 local_1c08 [3];
  bool _kj_shouldLog_74;
  undefined1 local_1bf0 [8];
  DebugExpression<kj::Maybe<int>_> local_1be8;
  undefined1 local_1be0 [8];
  DebugComparison<kj::Maybe<int>,_int> _kjCondition_74;
  bool _kj_shouldLog_73;
  StringPtr local_1ba0;
  DebugExpression<kj::Maybe<unsigned_long_long>_> local_1b90;
  undefined1 local_1b80 [8];
  DebugComparison<kj::Maybe<unsigned_long_long>,_int> _kjCondition_73;
  bool _kj_shouldLog_72;
  StringPtr local_1b38;
  DebugExpression<kj::Maybe<long_long>_> local_1b28;
  undefined1 local_1b18 [8];
  DebugComparison<kj::Maybe<long_long>,_int> _kjCondition_72;
  bool _kj_shouldLog_71;
  StringPtr local_1ad0;
  DebugExpression<kj::Maybe<unsigned_long>_> local_1ac0;
  undefined1 local_1ab0 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_int> _kjCondition_71;
  bool _kj_shouldLog_70;
  StringPtr local_1a68;
  DebugExpression<kj::Maybe<long>_> local_1a58;
  undefined1 local_1a48 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_70;
  bool _kj_shouldLog_69;
  undefined1 local_1a00 [8];
  DebugExpression<kj::Maybe<unsigned_int>_> local_19f8;
  undefined1 local_19f0 [8];
  DebugComparison<kj::Maybe<unsigned_int>,_int> _kjCondition_69;
  bool _kj_shouldLog_68;
  undefined1 local_19b0 [8];
  DebugExpression<kj::Maybe<int>_> local_19a8;
  undefined1 local_19a0 [8];
  DebugComparison<kj::Maybe<int>,_int> _kjCondition_68;
  bool _kj_shouldLog_67;
  undefined1 local_1960 [4];
  DebugExpression<kj::Maybe<unsigned_short>_> local_195c;
  undefined1 local_1958 [8];
  DebugComparison<kj::Maybe<unsigned_short>,_int> _kjCondition_67;
  bool _kj_shouldLog_66;
  undefined1 local_1920 [4];
  DebugExpression<kj::Maybe<short>_> local_191c;
  undefined1 local_1918 [8];
  DebugComparison<kj::Maybe<short>,_int> _kjCondition_66;
  bool _kj_shouldLog_65;
  undefined1 local_18dc [2];
  DebugExpression<kj::Maybe<unsigned_char>_> local_18da;
  undefined1 local_18d8 [8];
  DebugComparison<kj::Maybe<unsigned_char>,_int> _kjCondition_65;
  bool _kj_shouldLog_64;
  undefined1 local_189c [2];
  DebugExpression<kj::Maybe<signed_char>_> local_189a;
  undefined1 local_1898 [8];
  DebugComparison<kj::Maybe<signed_char>,_int> _kjCondition_64;
  bool _kj_shouldLog_63;
  undefined1 local_185c [2];
  DebugExpression<kj::Maybe<char>_> local_185a;
  undefined1 local_1858 [8];
  DebugComparison<kj::Maybe<char>,_int> _kjCondition_63;
  bool _kj_shouldLog_62;
  undefined1 local_181c [2];
  DebugExpression<kj::Maybe<unsigned_char>_> local_181a;
  undefined1 local_1818 [8];
  DebugComparison<kj::Maybe<unsigned_char>,_int> _kjCondition_62;
  bool _kj_shouldLog_61;
  undefined1 local_17dc [2];
  DebugExpression<kj::Maybe<signed_char>_> local_17da;
  undefined1 local_17d8 [8];
  DebugComparison<kj::Maybe<signed_char>,_int> _kjCondition_61;
  bool _kj_shouldLog_60;
  undefined1 local_17a0 [4];
  DebugExpression<kj::Maybe<unsigned_short>_> local_179c;
  undefined1 local_1798 [8];
  DebugComparison<kj::Maybe<unsigned_short>,_int> _kjCondition_60;
  bool _kj_shouldLog_59;
  undefined1 local_1760 [4];
  DebugExpression<kj::Maybe<short>_> local_175c;
  undefined1 local_1758 [8];
  DebugComparison<kj::Maybe<short>,_int> _kjCondition_59;
  bool _kj_shouldLog_58;
  undefined1 local_1720 [8];
  DebugExpression<kj::Maybe<unsigned_int>_> local_1718;
  undefined1 local_1710 [8];
  DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> _kjCondition_58;
  bool _kj_shouldLog_57;
  undefined1 local_16d0 [8];
  DebugExpression<kj::Maybe<unsigned_int>_> local_16c8;
  undefined1 local_16c0 [8];
  DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> _kjCondition_57;
  bool _kj_shouldLog_56;
  undefined1 local_1680 [8];
  DebugExpression<kj::Maybe<unsigned_int>_> local_1678;
  undefined1 local_1670 [8];
  DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> _kjCondition_56;
  bool _kj_shouldLog_55;
  undefined1 local_1630 [8];
  DebugExpression<kj::Maybe<unsigned_int>_> local_1628;
  undefined1 local_1620 [8];
  DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> _kjCondition_55;
  bool _kj_shouldLog_54;
  undefined1 local_15e0 [8];
  DebugExpression<kj::Maybe<unsigned_int>_> local_15d8;
  undefined1 local_15d0 [8];
  DebugComparison<kj::Maybe<unsigned_int>,_int> _kjCondition_54;
  bool _kj_shouldLog_53;
  undefined1 local_1590 [8];
  DebugExpression<kj::Maybe<int>_> local_1588;
  undefined1 local_1580 [8];
  DebugComparison<kj::Maybe<int>,_const_kj::None_&> _kjCondition_53;
  bool _kj_shouldLog_52;
  undefined1 local_1540 [8];
  DebugExpression<kj::Maybe<int>_> local_1538;
  undefined1 local_1530 [8];
  DebugComparison<kj::Maybe<int>,_const_kj::None_&> _kjCondition_52;
  long lStack_1500;
  bool _kj_shouldLog_51;
  ArrayPtr<const_char> local_14f8;
  undefined1 local_14e8 [8];
  DebugExpression<kj::Maybe<int>_> local_14e0;
  undefined1 local_14d8 [8];
  DebugComparison<kj::Maybe<int>,_long> _kjCondition_51;
  bool _kj_shouldLog_50;
  undefined1 local_1498 [8];
  DebugExpression<kj::Maybe<int>_> local_1490;
  undefined1 local_1488 [8];
  DebugComparison<kj::Maybe<int>,_int> _kjCondition_50;
  bool _kj_shouldLog_49;
  undefined1 local_1448 [8];
  DebugExpression<kj::Maybe<int>_> local_1440;
  undefined1 local_1438 [8];
  DebugComparison<kj::Maybe<int>,_int> _kjCondition_49;
  bool _kj_shouldLog_48;
  StringPtr local_13f8;
  DebugExpression<kj::Maybe<unsigned_long>_> local_13e8;
  undefined1 local_13d8 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> _kjCondition_48;
  bool _kj_shouldLog_47;
  StringPtr local_1390;
  DebugExpression<kj::Maybe<unsigned_long>_> local_1380;
  undefined1 local_1370 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> _kjCondition_47;
  bool _kj_shouldLog_46;
  StringPtr local_1328;
  DebugExpression<kj::Maybe<unsigned_long>_> local_1318;
  undefined1 local_1308 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> _kjCondition_46;
  bool _kj_shouldLog_45;
  StringPtr local_12c0;
  DebugExpression<kj::Maybe<unsigned_long>_> local_12b0;
  undefined1 local_12a0 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> _kjCondition_45;
  bool _kj_shouldLog_44;
  StringPtr local_1258;
  DebugExpression<kj::Maybe<unsigned_long>_> local_1248;
  undefined1 local_1238 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> _kjCondition_44;
  bool _kj_shouldLog_43;
  StringPtr local_11f0;
  DebugExpression<kj::Maybe<unsigned_long>_> local_11e0;
  undefined1 local_11d0 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> _kjCondition_43;
  unsigned_long_long uStack_1198;
  bool _kj_shouldLog_42;
  ArrayPtr<const_char> local_1190;
  StringPtr local_1180;
  DebugExpression<kj::Maybe<unsigned_long>_> local_1170;
  undefined1 local_1160 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long> _kjCondition_42;
  bool _kj_shouldLog_41;
  StringPtr local_1118;
  DebugExpression<kj::Maybe<unsigned_long>_> local_1108;
  undefined1 local_10f8 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_int> _kjCondition_41;
  bool _kj_shouldLog_40;
  StringPtr local_10b0;
  DebugExpression<kj::Maybe<unsigned_long>_> local_10a0;
  undefined1 local_1090 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_int> _kjCondition_40;
  bool _kj_shouldLog_39;
  StringPtr local_1048;
  DebugExpression<kj::Maybe<long>_> local_1038;
  undefined1 local_1028 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_39;
  bool _kj_shouldLog_38;
  StringPtr local_fe0;
  DebugExpression<kj::Maybe<long>_> local_fd0;
  undefined1 local_fc0 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_38;
  bool _kj_shouldLog_37;
  StringPtr local_f78;
  DebugExpression<kj::Maybe<long>_> local_f68;
  undefined1 local_f58 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_37;
  bool _kj_shouldLog_36;
  StringPtr local_f10;
  DebugExpression<kj::Maybe<long>_> local_f00;
  undefined1 local_ef0 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_36;
  bool _kj_shouldLog_35;
  StringPtr local_ea8;
  DebugExpression<kj::Maybe<long>_> local_e98;
  undefined1 local_e88 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_35;
  bool _kj_shouldLog_34;
  StringPtr local_e40;
  DebugExpression<kj::Maybe<long>_> local_e30;
  undefined1 local_e20 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_34;
  bool _kj_shouldLog_33;
  StringPtr local_dd8;
  DebugExpression<kj::Maybe<long>_> local_dc8;
  undefined1 local_db8 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_33;
  bool _kj_shouldLog_32;
  StringPtr local_d70;
  DebugExpression<kj::Maybe<long>_> local_d60;
  undefined1 local_d50 [8];
  DebugComparison<kj::Maybe<long>,_const_kj::None_&> _kjCondition_32;
  bool _kj_shouldLog_31;
  StringPtr local_d08;
  DebugExpression<kj::Maybe<long>_> local_cf8;
  undefined1 local_ce8 [8];
  DebugComparison<kj::Maybe<long>,_const_kj::None_&> _kjCondition_31;
  bool _kj_shouldLog_30;
  StringPtr local_ca0;
  DebugExpression<kj::Maybe<long>_> local_c90;
  undefined1 local_c80 [8];
  DebugComparison<kj::Maybe<long>,_const_kj::None_&> _kjCondition_30;
  bool _kj_shouldLog_29;
  StringPtr local_c38;
  DebugExpression<kj::Maybe<long>_> local_c28;
  undefined1 local_c18 [8];
  DebugComparison<kj::Maybe<long>,_const_kj::None_&> _kjCondition_29;
  bool _kj_shouldLog_28;
  StringPtr local_bd0;
  DebugExpression<kj::Maybe<long>_> local_bc0;
  undefined1 local_bb0 [8];
  DebugComparison<kj::Maybe<long>,_const_kj::None_&> _kjCondition_28;
  bool _kj_shouldLog_27;
  StringPtr local_b68;
  DebugExpression<kj::Maybe<long>_> local_b58;
  undefined1 local_b48 [8];
  DebugComparison<kj::Maybe<long>,_const_kj::None_&> _kjCondition_27;
  unsigned_long_long uStack_b10;
  bool _kj_shouldLog_26;
  ArrayPtr<const_char> local_b08;
  StringPtr local_af8;
  DebugExpression<kj::Maybe<long>_> local_ae8;
  undefined1 local_ad8 [8];
  DebugComparison<kj::Maybe<long>,_unsigned_long_long> _kjCondition_26;
  longlong lStack_aa0;
  bool _kj_shouldLog_25;
  ArrayPtr<const_char> local_a98;
  StringPtr local_a88;
  DebugExpression<kj::Maybe<long>_> local_a78;
  undefined1 local_a68 [8];
  DebugComparison<kj::Maybe<long>,_long_long> _kjCondition_25;
  bool _kj_shouldLog_24;
  StringPtr local_a20;
  DebugExpression<kj::Maybe<long>_> local_a10;
  undefined1 local_a00 [8];
  DebugComparison<kj::Maybe<long>,_int> _kjCondition_24;
  double dStack_9c8;
  bool _kj_shouldLog_23;
  ArrayPtr<const_char> local_9c0;
  undefined1 local_9b0 [8];
  DebugExpression<kj::Maybe<float>_> local_9a8;
  undefined1 local_9a0 [8];
  DebugComparison<kj::Maybe<float>,_double> _kjCondition_23;
  bool _kj_shouldLog_22;
  StringPtr local_960;
  DebugExpression<kj::Maybe<double>_> local_950;
  undefined1 local_940 [8];
  DebugComparison<kj::Maybe<double>,_const_kj::None_&> _kjCondition_22;
  bool _kj_shouldLog_21;
  StringPtr local_8f8;
  DebugExpression<kj::Maybe<double>_> local_8e8;
  undefined1 local_8d8 [8];
  DebugComparison<kj::Maybe<double>,_const_kj::None_&> _kjCondition_21;
  bool _kj_shouldLog_20;
  StringPtr local_890;
  DebugExpression<kj::Maybe<double>_> local_880;
  undefined1 local_870 [8];
  DebugComparison<kj::Maybe<double>,_const_kj::None_&> _kjCondition_20;
  bool _kj_shouldLog_19;
  StringPtr local_828;
  DebugExpression<kj::Maybe<double>_> local_818;
  undefined1 local_808 [8];
  DebugComparison<kj::Maybe<double>,_const_kj::None_&> _kjCondition_19;
  bool _kj_shouldLog_18;
  double dStack_7d0;
  ArrayPtr<const_char> local_7c8;
  StringPtr local_7b8;
  bool local_7a2;
  DebugExpression<bool> local_7a1;
  undefined1 local_7a0 [8];
  DebugComparison<bool,_bool> _kjCondition_18;
  bool _kj_shouldLog_17;
  double dStack_778;
  ArrayPtr<const_char> local_770;
  StringPtr local_760;
  bool local_74a;
  DebugExpression<bool> local_749;
  undefined1 local_748 [8];
  DebugComparison<bool,_bool> _kjCondition_17;
  bool _kj_shouldLog_16;
  double dStack_720;
  ArrayPtr<const_char> local_718;
  StringPtr local_708;
  bool local_6f2;
  DebugExpression<bool> local_6f1;
  undefined1 local_6f0 [8];
  DebugComparison<bool,_bool> _kjCondition_16;
  bool _kj_shouldLog_15;
  StringPtr local_6b8;
  DebugExpression<kj::Maybe<double>_> local_6a8;
  undefined1 local_698 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_15;
  bool _kj_shouldLog_14;
  StringPtr local_650;
  DebugExpression<kj::Maybe<double>_> local_640;
  undefined1 local_630 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_14;
  bool _kj_shouldLog_13;
  StringPtr local_5e8;
  DebugExpression<kj::Maybe<double>_> local_5d8;
  undefined1 local_5c8 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_13;
  bool _kj_shouldLog_12;
  StringPtr local_580;
  DebugExpression<kj::Maybe<double>_> local_570;
  undefined1 local_560 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_12;
  bool _kj_shouldLog_11;
  StringPtr local_518;
  DebugExpression<kj::Maybe<double>_> local_508;
  undefined1 local_4f8 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_11;
  bool _kj_shouldLog_10;
  StringPtr local_4b0;
  DebugExpression<kj::Maybe<double>_> local_4a0;
  undefined1 local_490 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_10;
  bool _kj_shouldLog_9;
  StringPtr local_448;
  DebugExpression<kj::Maybe<double>_> local_438;
  undefined1 local_428 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_9;
  bool _kj_shouldLog_8;
  StringPtr local_3e0;
  DebugExpression<kj::Maybe<double>_> local_3d0;
  undefined1 local_3c0 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_8;
  bool _kj_shouldLog_7;
  StringPtr local_378;
  DebugExpression<kj::Maybe<double>_> local_368;
  undefined1 local_358 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_7;
  bool _kj_shouldLog_6;
  StringPtr local_310;
  DebugExpression<kj::Maybe<double>_> local_300;
  undefined1 local_2f0 [8];
  DebugComparison<kj::Maybe<double>,_float> _kjCondition_6;
  double dStack_2b8;
  bool _kj_shouldLog_5;
  ArrayPtr<const_char> local_2b0;
  StringPtr local_2a0;
  DebugExpression<kj::Maybe<double>_> local_290;
  undefined1 local_280 [8];
  DebugComparison<kj::Maybe<double>,_double> _kjCondition_5;
  double dStack_248;
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_240;
  StringPtr local_230;
  DebugExpression<kj::Maybe<double>_> local_220;
  undefined1 local_210 [8];
  DebugComparison<kj::Maybe<double>,_double> _kjCondition_4;
  double dStack_1d8;
  bool _kj_shouldLog_3;
  ArrayPtr<const_char> local_1d0;
  StringPtr local_1c0;
  DebugExpression<kj::Maybe<double>_> local_1b0;
  undefined1 local_1a0 [8];
  DebugComparison<kj::Maybe<double>,_double> _kjCondition_3;
  double dStack_168;
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_160;
  StringPtr local_150;
  DebugExpression<kj::Maybe<double>_> local_140;
  undefined1 local_130 [8];
  DebugComparison<kj::Maybe<double>,_double> _kjCondition_2;
  double dStack_f8;
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_f0;
  StringPtr local_e0;
  DebugExpression<kj::Maybe<double>_> local_d0;
  undefined1 local_c0 [8];
  DebugComparison<kj::Maybe<double>,_double> _kjCondition_1;
  double dStack_88;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_70;
  StringPtr local_60;
  DebugExpression<kj::Maybe<double>_> local_50;
  undefined1 local_40 [8];
  DebugComparison<kj::Maybe<double>,_double> _kjCondition;
  TestCase168 *this_local;
  
  _kjCondition._40_8_ = this;
  local_70 = (ArrayPtr<const_char>)operator____kj("0",1);
  StringPtr::tryParseAs<double>(&local_60);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_50,(Maybe<double> *)&_::MAGIC_ASSERT);
  dStack_88 = 0.0;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_double> *)local_40,
             (DebugExpression<kj::Maybe<double>> *)&local_50,&stack0xffffffffffffff78);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_50);
  Maybe<double>::~Maybe((Maybe<double> *)&local_60);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    _kjCondition_1._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_1._47_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xa9,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
                 (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)local_40);
      _kjCondition_1._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_double>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_double> *)local_40);
  local_f0 = (ArrayPtr<const_char>)operator____kj("0",1);
  StringPtr::tryParseAs<double>(&local_e0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_d0,(Maybe<double> *)&_::MAGIC_ASSERT);
  dStack_f8 = 0.0;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_double> *)local_c0,
             (DebugExpression<kj::Maybe<double>> *)&local_d0,&stack0xffffffffffffff08);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_d0);
  Maybe<double>::~Maybe((Maybe<double> *)&local_e0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    _kjCondition_2._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_2._47_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xaa,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
                 (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)local_c0);
      _kjCondition_2._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_double>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_double> *)local_c0);
  local_160 = (ArrayPtr<const_char>)operator____kj("0.0",3);
  StringPtr::tryParseAs<double>(&local_150);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_140,(Maybe<double> *)&_::MAGIC_ASSERT);
  dStack_168 = 0.0;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_double> *)local_130,
             (DebugExpression<kj::Maybe<double>> *)&local_140,&stack0xfffffffffffffe98);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_140);
  Maybe<double>::~Maybe((Maybe<double> *)&local_150);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_130);
  if (!bVar1) {
    _kjCondition_3._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_3._47_1_ != '\0') {
      Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xab,ERROR,
                 "\"failed: expected \" \"\\\"0.0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition"
                 ,(char (*) [54])"failed: expected \"0.0\"_kj.tryParseAs<double>() == 0.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)local_130);
      _kjCondition_3._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_double>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_double> *)local_130);
  local_1d0 = (ArrayPtr<const_char>)operator____kj("1",1);
  StringPtr::tryParseAs<double>(&local_1c0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1b0,(Maybe<double> *)&_::MAGIC_ASSERT);
  dStack_1d8 = 1.0;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_double> *)local_1a0,
             (DebugExpression<kj::Maybe<double>> *)&local_1b0,&stack0xfffffffffffffe28);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_1b0);
  Maybe<double>::~Maybe((Maybe<double> *)&local_1c0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a0);
  if (!bVar1) {
    _kjCondition_4._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_4._47_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xac,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<double>() == 1.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)local_1a0);
      _kjCondition_4._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_double>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_double> *)local_1a0);
  local_240 = (ArrayPtr<const_char>)operator____kj("1.0",3);
  StringPtr::tryParseAs<double>(&local_230);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_220,(Maybe<double> *)&_::MAGIC_ASSERT);
  dStack_248 = 1.0;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_double> *)local_210,
             (DebugExpression<kj::Maybe<double>> *)&local_220,&stack0xfffffffffffffdb8);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_220);
  Maybe<double>::~Maybe((Maybe<double> *)&local_230);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
  if (!bVar1) {
    _kjCondition_5._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_5._47_1_ != '\0') {
      Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xad,ERROR,
                 "\"failed: expected \" \"\\\"1.0\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition"
                 ,(char (*) [54])"failed: expected \"1.0\"_kj.tryParseAs<double>() == 1.0",
                 (DebugComparison<kj::Maybe<double>,_double> *)local_210);
      _kjCondition_5._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_double>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_double> *)local_210);
  local_2b0 = (ArrayPtr<const_char>)operator____kj("1e100",5);
  StringPtr::tryParseAs<double>(&local_2a0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_290,(Maybe<double> *)&_::MAGIC_ASSERT);
  dStack_2b8 = 1e+100;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_double> *)local_280,
             (DebugExpression<kj::Maybe<double>> *)&local_290,&stack0xfffffffffffffd48);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_290);
  Maybe<double>::~Maybe((Maybe<double> *)&local_2a0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_280);
  if (!bVar1) {
    _kjCondition_6._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_6._47_1_ != '\0') {
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xae,ERROR,
                 "\"failed: expected \" \"\\\"1e100\\\"_kj.tryParseAs<double>() == 1e100\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"1e100\"_kj.tryParseAs<double>() == 1e100",
                 (DebugComparison<kj::Maybe<double>,_double> *)local_280);
      _kjCondition_6._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_double>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_double> *)local_280);
  operator____kj("inf",3);
  StringPtr::tryParseAs<double>(&local_310);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_300,(Maybe<double> *)&_::MAGIC_ASSERT);
  _kjCondition_7._44_4_ = inf();
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_2f0,
             (DebugExpression<kj::Maybe<double>> *)&local_300,(float *)&_kjCondition_7.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_300);
  Maybe<double>::~Maybe((Maybe<double> *)&local_310);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f0);
  if (!bVar1) {
    _kjCondition_7._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_7._43_1_ != '\0') {
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xaf,ERROR,
                 "\"failed: expected \" \"\\\"inf\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [56])"failed: expected \"inf\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_2f0);
      _kjCondition_7._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_2f0);
  operator____kj("infinity",8);
  StringPtr::tryParseAs<double>(&local_378);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_368,(Maybe<double> *)&_::MAGIC_ASSERT);
  _kjCondition_8._44_4_ = inf();
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_358,
             (DebugExpression<kj::Maybe<double>> *)&local_368,(float *)&_kjCondition_8.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_368);
  Maybe<double>::~Maybe((Maybe<double> *)&local_378);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_358);
  if (!bVar1) {
    _kjCondition_8._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_8._43_1_ != '\0') {
      Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb0,ERROR,
                 "\"failed: expected \" \"\\\"infinity\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [61])"failed: expected \"infinity\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_358);
      _kjCondition_8._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_358);
  operator____kj("INF",3);
  StringPtr::tryParseAs<double>(&local_3e0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_3d0,(Maybe<double> *)&_::MAGIC_ASSERT);
  _kjCondition_9._44_4_ = inf();
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_3c0,
             (DebugExpression<kj::Maybe<double>> *)&local_3d0,(float *)&_kjCondition_9.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_3d0);
  Maybe<double>::~Maybe((Maybe<double> *)&local_3e0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
  if (!bVar1) {
    _kjCondition_9._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_9._43_1_ != '\0') {
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb1,ERROR,
                 "\"failed: expected \" \"\\\"INF\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [56])"failed: expected \"INF\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_3c0);
      _kjCondition_9._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_3c0);
  operator____kj("INFINITY",8);
  StringPtr::tryParseAs<double>(&local_448);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_438,(Maybe<double> *)&_::MAGIC_ASSERT);
  _kjCondition_10._44_4_ = inf();
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_428,
             (DebugExpression<kj::Maybe<double>> *)&local_438,(float *)&_kjCondition_10.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_438);
  Maybe<double>::~Maybe((Maybe<double> *)&local_448);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_428);
  if (!bVar1) {
    _kjCondition_10._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_10._43_1_ != '\0') {
      Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"\\\"INFINITY\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [61])"failed: expected \"INFINITY\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_428);
      _kjCondition_10._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_428);
  operator____kj("1e100000",8);
  StringPtr::tryParseAs<double>(&local_4b0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_4a0,(Maybe<double> *)&_::MAGIC_ASSERT);
  _kjCondition_11._44_4_ = inf();
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_490,
             (DebugExpression<kj::Maybe<double>> *)&local_4a0,(float *)&_kjCondition_11.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_4a0);
  Maybe<double>::~Maybe((Maybe<double> *)&local_4b0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_490);
  if (!bVar1) {
    _kjCondition_11._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_11._43_1_ != '\0') {
      Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb3,ERROR,
                 "\"failed: expected \" \"\\\"1e100000\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
                 ,(char (*) [61])"failed: expected \"1e100000\"_kj.tryParseAs<double>() == inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_490);
      _kjCondition_11._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_490);
  operator____kj("-inf",4);
  StringPtr::tryParseAs<double>(&local_518);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_508,(Maybe<double> *)&_::MAGIC_ASSERT);
  fVar3 = inf();
  _kjCondition_12._44_4_ = -fVar3;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_4f8,
             (DebugExpression<kj::Maybe<double>> *)&local_508,(float *)&_kjCondition_12.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_508);
  Maybe<double>::~Maybe((Maybe<double> *)&local_518);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_4f8);
  if (!bVar1) {
    _kjCondition_12._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_12._43_1_ != '\0') {
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb4,ERROR,
                 "\"failed: expected \" \"\\\"-inf\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"-inf\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_4f8);
      _kjCondition_12._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_4f8);
  operator____kj("-infinity",9);
  StringPtr::tryParseAs<double>(&local_580);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_570,(Maybe<double> *)&_::MAGIC_ASSERT);
  fVar3 = inf();
  _kjCondition_13._44_4_ = -fVar3;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_560,
             (DebugExpression<kj::Maybe<double>> *)&local_570,(float *)&_kjCondition_13.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_570);
  Maybe<double>::~Maybe((Maybe<double> *)&local_580);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_560);
  if (!bVar1) {
    _kjCondition_13._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_13._43_1_ != '\0') {
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb5,ERROR,
                 "\"failed: expected \" \"\\\"-infinity\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [63])"failed: expected \"-infinity\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_560);
      _kjCondition_13._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_560);
  operator____kj("-INF",4);
  StringPtr::tryParseAs<double>(&local_5e8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_5d8,(Maybe<double> *)&_::MAGIC_ASSERT);
  fVar3 = inf();
  _kjCondition_14._44_4_ = -fVar3;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_5c8,
             (DebugExpression<kj::Maybe<double>> *)&local_5d8,(float *)&_kjCondition_14.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_5d8);
  Maybe<double>::~Maybe((Maybe<double> *)&local_5e8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_5c8);
  if (!bVar1) {
    _kjCondition_14._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_14._43_1_ != '\0') {
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb6,ERROR,
                 "\"failed: expected \" \"\\\"-INF\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"-INF\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_5c8);
      _kjCondition_14._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_5c8);
  operator____kj("-INFINITY",9);
  StringPtr::tryParseAs<double>(&local_650);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_640,(Maybe<double> *)&_::MAGIC_ASSERT);
  fVar3 = inf();
  _kjCondition_15._44_4_ = -fVar3;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_630,
             (DebugExpression<kj::Maybe<double>> *)&local_640,(float *)&_kjCondition_15.field_0x2c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_640);
  Maybe<double>::~Maybe((Maybe<double> *)&local_650);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_630);
  if (!bVar1) {
    _kjCondition_15._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_15._43_1_ != '\0') {
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb7,ERROR,
                 "\"failed: expected \" \"\\\"-INFINITY\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [63])"failed: expected \"-INFINITY\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_630);
      _kjCondition_15._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_630);
  operator____kj("-1e100000",9);
  StringPtr::tryParseAs<double>(&local_6b8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_6a8,(Maybe<double> *)&_::MAGIC_ASSERT);
  fVar3 = inf();
  _kjCondition_16._28_4_ = -fVar3;
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_float> *)local_698,
             (DebugExpression<kj::Maybe<double>> *)&local_6a8,(float *)&_kjCondition_16.field_0x1c);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_6a8);
  Maybe<double>::~Maybe((Maybe<double> *)&local_6b8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_698);
  if (!bVar1) {
    _kjCondition_16._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_16._27_1_ != '\0') {
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb8,ERROR,
                 "\"failed: expected \" \"\\\"-1e100000\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
                 ,(char (*) [63])"failed: expected \"-1e100000\"_kj.tryParseAs<double>() == -inf()",
                 (DebugComparison<kj::Maybe<double>,_float> *)local_698);
      _kjCondition_16._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_float>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_float> *)local_698);
  local_718 = (ArrayPtr<const_char>)operator____kj("nan",3);
  StringPtr::tryParseAs<double>(&local_708);
  dStack_720 = 0.0;
  pdVar2 = Maybe<double>::orDefault((Maybe<double> *)&local_708,&stack0xfffffffffffff8e0);
  local_6f2 = isNaN(*pdVar2);
  local_6f1 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_6f2);
  _kjCondition_17._31_1_ = 1;
  DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_6f0,&local_6f1,(bool *)&_kjCondition_17.field_0x1f
            );
  Maybe<double>::~Maybe((Maybe<double> *)&local_708);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_6f0);
  if (!bVar1) {
    _kjCondition_17._30_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_17._30_1_ != '\0') {
      Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb9,ERROR,
                 "\"failed: expected \" \"isNaN(\\\"nan\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
                 ,(char (*) [77])
                  "failed: expected isNaN(\"nan\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
                 (DebugComparison<bool,_bool> *)local_6f0);
      _kjCondition_17._30_1_ = 0;
    }
  }
  local_770 = (ArrayPtr<const_char>)operator____kj("NAN",3);
  StringPtr::tryParseAs<double>(&local_760);
  dStack_778 = 0.0;
  pdVar2 = Maybe<double>::orDefault((Maybe<double> *)&local_760,&stack0xfffffffffffff888);
  local_74a = isNaN(*pdVar2);
  local_749 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_74a);
  _kjCondition_18._31_1_ = 1;
  DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_748,&local_749,(bool *)&_kjCondition_18.field_0x1f
            );
  Maybe<double>::~Maybe((Maybe<double> *)&local_760);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_748);
  if (!bVar1) {
    _kjCondition_18._30_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_18._30_1_ != '\0') {
      Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xba,ERROR,
                 "\"failed: expected \" \"isNaN(\\\"NAN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
                 ,(char (*) [77])
                  "failed: expected isNaN(\"NAN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
                 (DebugComparison<bool,_bool> *)local_748);
      _kjCondition_18._30_1_ = 0;
    }
  }
  local_7c8 = (ArrayPtr<const_char>)operator____kj("NaN",3);
  StringPtr::tryParseAs<double>(&local_7b8);
  dStack_7d0 = 0.0;
  pdVar2 = Maybe<double>::orDefault((Maybe<double> *)&local_7b8,&stack0xfffffffffffff830);
  local_7a2 = isNaN(*pdVar2);
  local_7a1 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_7a2);
  _kjCondition_19._47_1_ = 1;
  DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_7a0,&local_7a1,(bool *)&_kjCondition_19.field_0x2f
            );
  Maybe<double>::~Maybe((Maybe<double> *)&local_7b8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_7a0);
  if (!bVar1) {
    _kjCondition_19._46_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_19._46_1_ != '\0') {
      Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xbb,ERROR,
                 "\"failed: expected \" \"isNaN(\\\"NaN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
                 ,(char (*) [77])
                  "failed: expected isNaN(\"NaN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
                 (DebugComparison<bool,_bool> *)local_7a0);
      _kjCondition_19._46_1_ = 0;
    }
  }
  operator____kj("",0);
  StringPtr::tryParseAs<double>(&local_828);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_818,(Maybe<double> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_808,
             (DebugExpression<kj::Maybe<double>> *)&local_818,(None *)&kj::none);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_818);
  Maybe<double>::~Maybe((Maybe<double> *)&local_828);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_808);
  if (!bVar1) {
    _kjCondition_20._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_20._47_1_ != '\0') {
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xbc,ERROR,
                 "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
                 ,(char (*) [56])"failed: expected \"\"_kj.tryParseAs<double>() == kj::none",
                 (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_808);
      _kjCondition_20._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_808);
  operator____kj("a",1);
  StringPtr::tryParseAs<double>(&local_890);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_880,(Maybe<double> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_870,
             (DebugExpression<kj::Maybe<double>> *)&local_880,(None *)&kj::none);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_880);
  Maybe<double>::~Maybe((Maybe<double> *)&local_890);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_870);
  if (!bVar1) {
    _kjCondition_21._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_21._47_1_ != '\0') {
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xbd,ERROR,
                 "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"a\"_kj.tryParseAs<double>() == kj::none",
                 (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_870);
      _kjCondition_21._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_870);
  operator____kj("1a",2);
  StringPtr::tryParseAs<double>(&local_8f8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_8e8,(Maybe<double> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_8d8,
             (DebugExpression<kj::Maybe<double>> *)&local_8e8,(None *)&kj::none);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_8e8);
  Maybe<double>::~Maybe((Maybe<double> *)&local_8f8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_8d8);
  if (!bVar1) {
    _kjCondition_22._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_22._47_1_ != '\0') {
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xbe,ERROR,
                 "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"1a\"_kj.tryParseAs<double>() == kj::none",
                 (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_8d8);
      _kjCondition_22._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_8d8);
  operator____kj("+-1",3);
  StringPtr::tryParseAs<double>(&local_960);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_950,(Maybe<double> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<double>>::operator==
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_940,
             (DebugExpression<kj::Maybe<double>> *)&local_950,(None *)&kj::none);
  DebugExpression<kj::Maybe<double>_>::~DebugExpression(&local_950);
  Maybe<double>::~Maybe((Maybe<double> *)&local_960);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_940);
  if (!bVar1) {
    _kjCondition_23._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_23._39_1_ != '\0') {
      Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xbf,ERROR,
                 "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
                 ,(char (*) [59])"failed: expected \"+-1\"_kj.tryParseAs<double>() == kj::none",
                 (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_940);
      _kjCondition_23._39_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<double>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)local_940);
  local_9c0 = (ArrayPtr<const_char>)operator____kj("1",1);
  StringPtr::tryParseAs<float>((StringPtr *)local_9b0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_9a8,(Maybe<float> *)&_::MAGIC_ASSERT);
  dStack_9c8 = 1.0;
  DebugExpression<kj::Maybe<float>>::operator==
            ((DebugComparison<kj::Maybe<float>,_double> *)local_9a0,
             (DebugExpression<kj::Maybe<float>> *)&local_9a8,&stack0xfffffffffffff638);
  DebugExpression<kj::Maybe<float>_>::~DebugExpression(&local_9a8);
  Maybe<float>::~Maybe((Maybe<float> *)local_9b0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_9a0);
  if (!bVar1) {
    _kjCondition_24._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_24._47_1_ != '\0') {
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<float>,double>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc1,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<float>() == 1.0\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<float>() == 1.0",
                 (DebugComparison<kj::Maybe<float>,_double> *)local_9a0);
      _kjCondition_24._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<float>,_double>::~DebugComparison
            ((DebugComparison<kj::Maybe<float>,_double> *)local_9a0);
  operator____kj("1",1);
  StringPtr::tryParseAs<long>(&local_a20);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_a10,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_25._44_4_ = 1;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_a00,
             (DebugExpression<kj::Maybe<long>> *)&local_a10,(int *)&_kjCondition_25.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_a10);
  Maybe<long>::~Maybe((Maybe<long> *)&local_a20);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_a00);
  if (!bVar1) {
    _kjCondition_25._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_25._43_1_ != '\0') {
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc3,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int64_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int64_t>() == 1",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_a00);
      _kjCondition_25._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_a00);
  local_a98 = (ArrayPtr<const_char>)operator____kj("9223372036854775807",0x13);
  StringPtr::tryParseAs<long>(&local_a88);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_a78,(Maybe<long> *)&_::MAGIC_ASSERT);
  lStack_aa0 = 0x7fffffffffffffff;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_long_long> *)local_a68,
             (DebugExpression<kj::Maybe<long>> *)&local_a78,&stack0xfffffffffffff560);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_a78);
  Maybe<long>::~Maybe((Maybe<long> *)&local_a88);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_a68);
  if (!bVar1) {
    _kjCondition_26._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_26._47_1_ != '\0') {
      Debug::log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<long>,long_long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc4,ERROR,
                 "\"failed: expected \" \"\\\"9223372036854775807\\\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL\", _kjCondition"
                 ,(char (*) [89])
                  "failed: expected \"9223372036854775807\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL"
                 ,(DebugComparison<kj::Maybe<long>,_long_long> *)local_a68);
      _kjCondition_26._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_long_long>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_long_long> *)local_a68);
  local_b08 = (ArrayPtr<const_char>)operator____kj("-9223372036854775808",0x14);
  StringPtr::tryParseAs<long>(&local_af8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_ae8,(Maybe<long> *)&_::MAGIC_ASSERT);
  uStack_b10 = 0x8000000000000000;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_unsigned_long_long> *)local_ad8,
             (DebugExpression<kj::Maybe<long>> *)&local_ae8,&stack0xfffffffffffff4f0);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_ae8);
  Maybe<long>::~Maybe((Maybe<long> *)&local_af8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ad8);
  if (!bVar1) {
    _kjCondition_27._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_27._47_1_ != '\0') {
      Debug::log<char_const(&)[92],kj::_::DebugComparison<kj::Maybe<long>,unsigned_long_long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc5,ERROR,
                 "\"failed: expected \" \"\\\"-9223372036854775808\\\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL\", _kjCondition"
                 ,(char (*) [92])
                  "failed: expected \"-9223372036854775808\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL"
                 ,(DebugComparison<kj::Maybe<long>,_unsigned_long_long> *)local_ad8);
      _kjCondition_27._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_unsigned_long_long>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_unsigned_long_long> *)local_ad8);
  operator____kj("9223372036854775808",0x13);
  StringPtr::tryParseAs<long>(&local_b68);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_b58,(Maybe<long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_b48,
             (DebugExpression<kj::Maybe<long>> *)&local_b58,(None *)&kj::none);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_b58);
  Maybe<long>::~Maybe((Maybe<long> *)&local_b68);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_b48);
  if (!bVar1) {
    _kjCondition_28._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_28._47_1_ != '\0') {
      Debug::log<char_const(&)[76],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc6,ERROR,
                 "\"failed: expected \" \"\\\"9223372036854775808\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [76])
                  "failed: expected \"9223372036854775808\"_kj.tryParseAs<int64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_b48);
      _kjCondition_28._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_b48);
  operator____kj("-9223372036854775809",0x14);
  StringPtr::tryParseAs<long>(&local_bd0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_bc0,(Maybe<long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_bb0,
             (DebugExpression<kj::Maybe<long>> *)&local_bc0,(None *)&kj::none);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_bc0);
  Maybe<long>::~Maybe((Maybe<long> *)&local_bd0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_bb0);
  if (!bVar1) {
    _kjCondition_29._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_29._47_1_ != '\0') {
      Debug::log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,199,ERROR,
                 "\"failed: expected \" \"\\\"-9223372036854775809\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [77])
                  "failed: expected \"-9223372036854775809\"_kj.tryParseAs<int64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_bb0);
      _kjCondition_29._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_bb0);
  operator____kj("",0);
  StringPtr::tryParseAs<long>(&local_c38);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_c28,(Maybe<long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_c18,
             (DebugExpression<kj::Maybe<long>> *)&local_c28,(None *)&kj::none);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_c28);
  Maybe<long>::~Maybe((Maybe<long> *)&local_c38);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_c18);
  if (!bVar1) {
    _kjCondition_30._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_30._47_1_ != '\0') {
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,200,ERROR,
                 "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"\"_kj.tryParseAs<int64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_c18);
      _kjCondition_30._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_c18);
  operator____kj("a",1);
  StringPtr::tryParseAs<long>(&local_ca0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_c90,(Maybe<long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_c80,
             (DebugExpression<kj::Maybe<long>> *)&local_c90,(None *)&kj::none);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_c90);
  Maybe<long>::~Maybe((Maybe<long> *)&local_ca0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_c80);
  if (!bVar1) {
    _kjCondition_31._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_31._47_1_ != '\0') {
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xc9,ERROR,
                 "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"a\"_kj.tryParseAs<int64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_c80);
      _kjCondition_31._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_c80);
  operator____kj("1a",2);
  StringPtr::tryParseAs<long>(&local_d08);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_cf8,(Maybe<long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_ce8,
             (DebugExpression<kj::Maybe<long>> *)&local_cf8,(None *)&kj::none);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_cf8);
  Maybe<long>::~Maybe((Maybe<long> *)&local_d08);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ce8);
  if (!bVar1) {
    _kjCondition_32._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_32._47_1_ != '\0') {
      Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xca,ERROR,
                 "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [59])"failed: expected \"1a\"_kj.tryParseAs<int64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_ce8);
      _kjCondition_32._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_ce8);
  operator____kj("+-1",3);
  StringPtr::tryParseAs<long>(&local_d70);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_d60,(Maybe<long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_d50,
             (DebugExpression<kj::Maybe<long>> *)&local_d60,(None *)&kj::none);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_d60);
  Maybe<long>::~Maybe((Maybe<long> *)&local_d70);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_d50);
  if (!bVar1) {
    _kjCondition_33._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_33._47_1_ != '\0') {
      Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xcb,ERROR,
                 "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [60])"failed: expected \"+-1\"_kj.tryParseAs<int64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_d50);
      _kjCondition_33._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)local_d50);
  operator____kj("010",3);
  StringPtr::tryParseAs<long>(&local_dd8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_dc8,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_34._44_4_ = 10;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_db8,
             (DebugExpression<kj::Maybe<long>> *)&local_dc8,(int *)&_kjCondition_34.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_dc8);
  Maybe<long>::~Maybe((Maybe<long> *)&local_dd8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_db8);
  if (!bVar1) {
    _kjCondition_34._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_34._43_1_ != '\0') {
      Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xcc,ERROR,
                 "\"failed: expected \" \"\\\"010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition"
                 ,(char (*) [54])"failed: expected \"010\"_kj.tryParseAs<int64_t>() == 10",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_db8);
      _kjCondition_34._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_db8);
  operator____kj("0010",4);
  StringPtr::tryParseAs<long>(&local_e40);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_e30,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_35._44_4_ = 10;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_e20,
             (DebugExpression<kj::Maybe<long>> *)&local_e30,(int *)&_kjCondition_35.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_e30);
  Maybe<long>::~Maybe((Maybe<long> *)&local_e40);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_e20);
  if (!bVar1) {
    _kjCondition_35._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_35._43_1_ != '\0') {
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xcd,ERROR,
                 "\"failed: expected \" \"\\\"0010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"0010\"_kj.tryParseAs<int64_t>() == 10",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_e20);
      _kjCondition_35._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_e20);
  operator____kj("0x10",4);
  StringPtr::tryParseAs<long>(&local_ea8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_e98,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_36._44_4_ = 0x10;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_e88,
             (DebugExpression<kj::Maybe<long>> *)&local_e98,(int *)&_kjCondition_36.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_e98);
  Maybe<long>::~Maybe((Maybe<long> *)&local_ea8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_e88);
  if (!bVar1) {
    _kjCondition_36._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_36._43_1_ != '\0') {
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xce,ERROR,
                 "\"failed: expected \" \"\\\"0x10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"0x10\"_kj.tryParseAs<int64_t>() == 16",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_e88);
      _kjCondition_36._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_e88);
  operator____kj("0X10",4);
  StringPtr::tryParseAs<long>(&local_f10);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_f00,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_37._44_4_ = 0x10;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_ef0,
             (DebugExpression<kj::Maybe<long>> *)&local_f00,(int *)&_kjCondition_37.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_f00);
  Maybe<long>::~Maybe((Maybe<long> *)&local_f10);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ef0);
  if (!bVar1) {
    _kjCondition_37._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_37._43_1_ != '\0') {
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xcf,ERROR,
                 "\"failed: expected \" \"\\\"0X10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"0X10\"_kj.tryParseAs<int64_t>() == 16",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_ef0);
      _kjCondition_37._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_ef0);
  operator____kj("-010",4);
  StringPtr::tryParseAs<long>(&local_f78);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_f68,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_38._44_4_ = 0xfffffff6;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_f58,
             (DebugExpression<kj::Maybe<long>> *)&local_f68,(int *)&_kjCondition_38.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_f68);
  Maybe<long>::~Maybe((Maybe<long> *)&local_f78);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_f58);
  if (!bVar1) {
    _kjCondition_38._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_38._43_1_ != '\0') {
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd0,ERROR,
                 "\"failed: expected \" \"\\\"-010\\\"_kj.tryParseAs<int64_t>() == -10\", _kjCondition"
                 ,(char (*) [56])"failed: expected \"-010\"_kj.tryParseAs<int64_t>() == -10",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_f58);
      _kjCondition_38._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_f58);
  operator____kj("-0x10",5);
  StringPtr::tryParseAs<long>(&local_fe0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_fd0,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_39._44_4_ = 0xfffffff0;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_fc0,
             (DebugExpression<kj::Maybe<long>> *)&local_fd0,(int *)&_kjCondition_39.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_fd0);
  Maybe<long>::~Maybe((Maybe<long> *)&local_fe0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_fc0);
  if (!bVar1) {
    _kjCondition_39._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_39._43_1_ != '\0') {
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd1,ERROR,
                 "\"failed: expected \" \"\\\"-0x10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"-0x10\"_kj.tryParseAs<int64_t>() == -16",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_fc0);
      _kjCondition_39._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_fc0);
  operator____kj("-0X10",5);
  StringPtr::tryParseAs<long>(&local_1048);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1038,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_40._44_4_ = 0xfffffff0;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_1028,
             (DebugExpression<kj::Maybe<long>> *)&local_1038,(int *)&_kjCondition_40.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_1038);
  Maybe<long>::~Maybe((Maybe<long> *)&local_1048);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1028);
  if (!bVar1) {
    _kjCondition_40._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_40._43_1_ != '\0') {
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd2,ERROR,
                 "\"failed: expected \" \"\\\"-0X10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"-0X10\"_kj.tryParseAs<int64_t>() == -16",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_1028);
      _kjCondition_40._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_1028);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_long>(&local_10b0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_10a0,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  _kjCondition_41._44_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_1090,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_10a0,
             (int *)&_kjCondition_41.field_0x2c);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_10a0);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_10b0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1090);
  if (!bVar1) {
    _kjCondition_41._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_41._43_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd4,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint64_t>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint64_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_1090);
      _kjCondition_41._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_1090);
  operator____kj("0",1);
  StringPtr::tryParseAs<unsigned_long>(&local_1118);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1108,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  _kjCondition_42._44_4_ = 0;
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_10f8,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_1108,
             (int *)&_kjCondition_42.field_0x2c);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_1108);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_1118);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_10f8);
  if (!bVar1) {
    _kjCondition_42._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_42._43_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd5,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint64_t>() == 0\", _kjCondition",
                 (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<uint64_t>() == 0",
                 (DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_10f8);
      _kjCondition_42._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_10f8);
  local_1190 = (ArrayPtr<const_char>)operator____kj("18446744073709551615",0x14);
  StringPtr::tryParseAs<unsigned_long>(&local_1180);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1170,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  uStack_1198 = 0xffffffffffffffff;
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long> *)local_1160,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_1170,&stack0xffffffffffffee68);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_1170);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_1180);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1160);
  if (!bVar1) {
    _kjCondition_43._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_43._47_1_ != '\0') {
      Debug::
      log<char_const(&)[93],kj::_::DebugComparison<kj::Maybe<unsigned_long>,unsigned_long_long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd6,ERROR,
                 "\"failed: expected \" \"\\\"18446744073709551615\\\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL\", _kjCondition"
                 ,(char (*) [93])
                  "failed: expected \"18446744073709551615\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL"
                 ,(DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long> *)local_1160);
      _kjCondition_43._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long> *)local_1160);
  operator____kj("-1",2);
  StringPtr::tryParseAs<unsigned_long>(&local_11f0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_11e0,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_11d0,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_11e0,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_11e0);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_11f0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_11d0);
  if (!bVar1) {
    _kjCondition_44._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_44._47_1_ != '\0') {
      Debug::
      log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd7,ERROR,
                 "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_11d0);
      _kjCondition_44._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_11d0);
  operator____kj("18446744073709551616",0x14);
  StringPtr::tryParseAs<unsigned_long>(&local_1258);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1248,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1238,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_1248,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_1248);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_1258);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1238);
  if (!bVar1) {
    _kjCondition_45._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_45._47_1_ != '\0') {
      Debug::
      log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd8,ERROR,
                 "\"failed: expected \" \"\\\"18446744073709551616\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected \"18446744073709551616\"_kj.tryParseAs<uint64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1238);
      _kjCondition_45._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1238);
  operator____kj("",0);
  StringPtr::tryParseAs<unsigned_long>(&local_12c0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_12b0,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_12a0,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_12b0,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_12b0);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_12c0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_12a0);
  if (!bVar1) {
    _kjCondition_46._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_46._47_1_ != '\0') {
      Debug::
      log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xd9,ERROR,
                 "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"\"_kj.tryParseAs<uint64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_12a0);
      _kjCondition_46._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_12a0);
  operator____kj("a",1);
  StringPtr::tryParseAs<unsigned_long>(&local_1328);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1318,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1308,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_1318,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_1318);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_1328);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1308);
  if (!bVar1) {
    _kjCondition_47._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_47._47_1_ != '\0') {
      Debug::
      log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xda,ERROR,
                 "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [59])"failed: expected \"a\"_kj.tryParseAs<uint64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1308);
      _kjCondition_47._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1308);
  operator____kj("1a",2);
  StringPtr::tryParseAs<unsigned_long>(&local_1390);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1380,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1370,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_1380,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_1380);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_1390);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1370);
  if (!bVar1) {
    _kjCondition_48._47_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_48._47_1_ != '\0') {
      Debug::
      log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [60])"failed: expected \"1a\"_kj.tryParseAs<uint64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1370);
      _kjCondition_48._47_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_1370);
  operator____kj("+-1",3);
  StringPtr::tryParseAs<unsigned_long>(&local_13f8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_13e8,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_13d8,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_13e8,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_13e8);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_13f8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_13d8);
  if (!bVar1) {
    _kjCondition_49._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_49._39_1_ != '\0') {
      Debug::
      log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
                 ,(char (*) [61])"failed: expected \"+-1\"_kj.tryParseAs<uint64_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_13d8);
      _kjCondition_49._39_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_13d8);
  operator____kj("1",1);
  StringPtr::tryParseAs<int>((StringPtr *)local_1448);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1440,(Maybe<int> *)&_::MAGIC_ASSERT);
  _kjCondition_50._36_4_ = 1;
  DebugExpression<kj::Maybe<int>>::operator==
            ((DebugComparison<kj::Maybe<int>,_int> *)local_1438,
             (DebugExpression<kj::Maybe<int>> *)&local_1440,(int *)&_kjCondition_50.field_0x24);
  DebugExpression<kj::Maybe<int>_>::~DebugExpression(&local_1440);
  Maybe<int>::~Maybe((Maybe<int> *)local_1448);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1438);
  if (!bVar1) {
    _kjCondition_50._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_50._35_1_ != '\0') {
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xde,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int32_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int32_t>() == 1",
                 (DebugComparison<kj::Maybe<int>,_int> *)local_1438);
      _kjCondition_50._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<int>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<int>,_int> *)local_1438);
  operator____kj("2147483647",10);
  StringPtr::tryParseAs<int>((StringPtr *)local_1498);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1490,(Maybe<int> *)&_::MAGIC_ASSERT);
  _kjCondition_51._36_4_ = 0x7fffffff;
  DebugExpression<kj::Maybe<int>>::operator==
            ((DebugComparison<kj::Maybe<int>,_int> *)local_1488,
             (DebugExpression<kj::Maybe<int>> *)&local_1490,(int *)&_kjCondition_51.field_0x24);
  DebugExpression<kj::Maybe<int>_>::~DebugExpression(&local_1490);
  Maybe<int>::~Maybe((Maybe<int> *)local_1498);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1488);
  if (!bVar1) {
    _kjCondition_51._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_51._35_1_ != '\0') {
      Debug::log<char_const(&)[69],kj::_::DebugComparison<kj::Maybe<int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"\\\"2147483647\\\"_kj.tryParseAs<int32_t>() == 2147483647\", _kjCondition"
                 ,(char (*) [69])
                  "failed: expected \"2147483647\"_kj.tryParseAs<int32_t>() == 2147483647",
                 (DebugComparison<kj::Maybe<int>,_int> *)local_1488);
      _kjCondition_51._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<int>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<int>,_int> *)local_1488);
  local_14f8 = (ArrayPtr<const_char>)operator____kj("-2147483648",0xb);
  StringPtr::tryParseAs<int>((StringPtr *)local_14e8);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_14e0,(Maybe<int> *)&_::MAGIC_ASSERT);
  lStack_1500 = -0x80000000;
  DebugExpression<kj::Maybe<int>>::operator==
            ((DebugComparison<kj::Maybe<int>,_long> *)local_14d8,
             (DebugExpression<kj::Maybe<int>> *)&local_14e0,&stack0xffffffffffffeb00);
  DebugExpression<kj::Maybe<int>_>::~DebugExpression(&local_14e0);
  Maybe<int>::~Maybe((Maybe<int> *)local_14e8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_14d8);
  if (!bVar1) {
    _kjCondition_52._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_52._39_1_ != '\0') {
      Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<int>,long>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe0,ERROR,
                 "\"failed: expected \" \"\\\"-2147483648\\\"_kj.tryParseAs<int32_t>() == -2147483648\", _kjCondition"
                 ,(char (*) [71])
                  "failed: expected \"-2147483648\"_kj.tryParseAs<int32_t>() == -2147483648",
                 (DebugComparison<kj::Maybe<int>,_long> *)local_14d8);
      _kjCondition_52._39_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<int>,_long>::~DebugComparison
            ((DebugComparison<kj::Maybe<int>,_long> *)local_14d8);
  operator____kj("2147483648",10);
  StringPtr::tryParseAs<int>((StringPtr *)local_1540);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1538,(Maybe<int> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<int>>::operator==
            ((DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_1530,
             (DebugExpression<kj::Maybe<int>> *)&local_1538,(None *)&kj::none);
  DebugExpression<kj::Maybe<int>_>::~DebugExpression(&local_1538);
  Maybe<int>::~Maybe((Maybe<int> *)local_1540);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1530);
  if (!bVar1) {
    _kjCondition_53._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_53._39_1_ != '\0') {
      Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"\\\"2147483648\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
                 ,(char (*) [67])
                  "failed: expected \"2147483648\"_kj.tryParseAs<int32_t>() == kj::none",
                 (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_1530);
      _kjCondition_53._39_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<int>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_1530);
  operator____kj("-2147483649",0xb);
  StringPtr::tryParseAs<int>((StringPtr *)local_1590);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1588,(Maybe<int> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<int>>::operator==
            ((DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_1580,
             (DebugExpression<kj::Maybe<int>> *)&local_1588,(None *)&kj::none);
  DebugExpression<kj::Maybe<int>_>::~DebugExpression(&local_1588);
  Maybe<int>::~Maybe((Maybe<int> *)local_1590);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1580);
  if (!bVar1) {
    _kjCondition_54._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_54._39_1_ != '\0') {
      Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe2,ERROR,
                 "\"failed: expected \" \"\\\"-2147483649\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
                 ,(char (*) [68])
                  "failed: expected \"-2147483649\"_kj.tryParseAs<int32_t>() == kj::none",
                 (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_1580);
      _kjCondition_54._39_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<int>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)local_1580);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_15e0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_15d8,(Maybe<unsigned_int> *)&_::MAGIC_ASSERT);
  _kjCondition_55._36_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_int>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_int>,_int> *)local_15d0,
             (DebugExpression<kj::Maybe<unsigned_int>> *)&local_15d8,
             (int *)&_kjCondition_55.field_0x24);
  DebugExpression<kj::Maybe<unsigned_int>_>::~DebugExpression(&local_15d8);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_15e0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_15d0);
  if (!bVar1) {
    _kjCondition_55._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_55._35_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe4,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint32_t>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint32_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_int>,_int> *)local_15d0);
      _kjCondition_55._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_int>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_int>,_int> *)local_15d0);
  operator____kj("0",1);
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_1630);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1628,(Maybe<unsigned_int> *)&_::MAGIC_ASSERT);
  _kjCondition_56._36_4_ = 0;
  DebugExpression<kj::Maybe<unsigned_int>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)local_1620,
             (DebugExpression<kj::Maybe<unsigned_int>> *)&local_1628,
             (uint *)&_kjCondition_56.field_0x24);
  DebugExpression<kj::Maybe<unsigned_int>_>::~DebugExpression(&local_1628);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_1630);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1620);
  if (!bVar1) {
    _kjCondition_56._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_56._35_1_ != '\0') {
      Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint32_t>() == 0U\", _kjCondition"
                 ,(char (*) [53])"failed: expected \"0\"_kj.tryParseAs<uint32_t>() == 0U",
                 (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)local_1620);
      _kjCondition_56._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)local_1620);
  operator____kj("4294967295",10);
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_1680);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1678,(Maybe<unsigned_int> *)&_::MAGIC_ASSERT);
  _kjCondition_57._36_4_ = 0xffffffff;
  DebugExpression<kj::Maybe<unsigned_int>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)local_1670,
             (DebugExpression<kj::Maybe<unsigned_int>> *)&local_1678,
             (uint *)&_kjCondition_57.field_0x24);
  DebugExpression<kj::Maybe<unsigned_int>_>::~DebugExpression(&local_1678);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_1680);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1670);
  if (!bVar1) {
    _kjCondition_57._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_57._35_1_ != '\0') {
      Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"\\\"4294967295\\\"_kj.tryParseAs<uint32_t>() == 4294967295U\", _kjCondition"
                 ,(char (*) [71])
                  "failed: expected \"4294967295\"_kj.tryParseAs<uint32_t>() == 4294967295U",
                 (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)local_1670);
      _kjCondition_57._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)local_1670);
  operator____kj("-1",2);
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_16d0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_16c8,(Maybe<unsigned_int> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_int>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)local_16c0,
             (DebugExpression<kj::Maybe<unsigned_int>> *)&local_16c8,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_int>_>::~DebugExpression(&local_16c8);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_16d0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_16c0);
  if (!bVar1) {
    _kjCondition_58._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_58._39_1_ != '\0') {
      Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe7,ERROR,
                 "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
                 ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint32_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)local_16c0);
      _kjCondition_58._39_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)local_16c0);
  operator____kj("4294967296",10);
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_1720);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1718,(Maybe<unsigned_int> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<unsigned_int>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)local_1710,
             (DebugExpression<kj::Maybe<unsigned_int>> *)&local_1718,(None *)&kj::none);
  DebugExpression<kj::Maybe<unsigned_int>_>::~DebugExpression(&local_1718);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_1720);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1710);
  if (!bVar1) {
    _kjCondition_59._31_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_59._31_1_ != '\0') {
      Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xe8,ERROR,
                 "\"failed: expected \" \"\\\"4294967296\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
                 ,(char (*) [68])
                  "failed: expected \"4294967296\"_kj.tryParseAs<uint32_t>() == kj::none",
                 (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)local_1710);
      _kjCondition_59._31_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)local_1710);
  operator____kj("1",1);
  StringPtr::tryParseAs<short>((StringPtr *)local_1760);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_175c,(Maybe<short> *)&_::MAGIC_ASSERT);
  _kjCondition_60._28_4_ = 1;
  DebugExpression<kj::Maybe<short>>::operator==
            ((DebugComparison<kj::Maybe<short>,_int> *)local_1758,
             (DebugExpression<kj::Maybe<short>> *)&local_175c,(int *)&_kjCondition_60.field_0x1c);
  DebugExpression<kj::Maybe<short>_>::~DebugExpression(&local_175c);
  Maybe<short>::~Maybe((Maybe<short> *)local_1760);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1758);
  if (!bVar1) {
    _kjCondition_60._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_60._27_1_ != '\0') {
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int16_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int16_t>() == 1",
                 (DebugComparison<kj::Maybe<short>,_int> *)local_1758);
      _kjCondition_60._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<short>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<short>,_int> *)local_1758);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_17a0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_179c,(Maybe<unsigned_short> *)&_::MAGIC_ASSERT);
  _kjCondition_61._28_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_short>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_short>,_int> *)local_1798,
             (DebugExpression<kj::Maybe<unsigned_short>> *)&local_179c,
             (int *)&_kjCondition_61.field_0x1c);
  DebugExpression<kj::Maybe<unsigned_short>_>::~DebugExpression(&local_179c);
  Maybe<unsigned_short>::~Maybe((Maybe<unsigned_short> *)local_17a0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1798);
  if (!bVar1) {
    _kjCondition_61._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_61._27_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint16_t>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint16_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_short>,_int> *)local_1798);
      _kjCondition_61._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_short>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_short>,_int> *)local_1798);
  operator____kj("1",1);
  StringPtr::tryParseAs<signed_char>((StringPtr *)local_17dc);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_17da,(Maybe<signed_char> *)&_::MAGIC_ASSERT);
  _kjCondition_62._28_4_ = 1;
  DebugExpression<kj::Maybe<signed_char>>::operator==
            ((DebugComparison<kj::Maybe<signed_char>,_int> *)local_17d8,
             (DebugExpression<kj::Maybe<signed_char>> *)&local_17da,
             (int *)&_kjCondition_62.field_0x1c);
  DebugExpression<kj::Maybe<signed_char>_>::~DebugExpression(&local_17da);
  Maybe<signed_char>::~Maybe((Maybe<signed_char> *)local_17dc);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_17d8);
  if (!bVar1) {
    _kjCondition_62._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_62._27_1_ != '\0') {
      Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int8_t>() == 1\", _kjCondition",
                 (char (*) [50])"failed: expected \"1\"_kj.tryParseAs<int8_t>() == 1",
                 (DebugComparison<kj::Maybe<signed_char>,_int> *)local_17d8);
      _kjCondition_62._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<signed_char>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<signed_char>,_int> *)local_17d8);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_181c);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_181a,(Maybe<unsigned_char> *)&_::MAGIC_ASSERT);
  _kjCondition_63._28_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_char>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_char>,_int> *)local_1818,
             (DebugExpression<kj::Maybe<unsigned_char>> *)&local_181a,
             (int *)&_kjCondition_63.field_0x1c);
  DebugExpression<kj::Maybe<unsigned_char>_>::~DebugExpression(&local_181a);
  Maybe<unsigned_char>::~Maybe((Maybe<unsigned_char> *)local_181c);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1818);
  if (!bVar1) {
    _kjCondition_63._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_63._27_1_ != '\0') {
      Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint8_t>() == 1\", _kjCondition",
                 (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<uint8_t>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_char>,_int> *)local_1818);
      _kjCondition_63._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_char>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_char>,_int> *)local_1818);
  operator____kj("1",1);
  StringPtr::tryParseAs<char>((StringPtr *)local_185c);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_185a,(Maybe<char> *)&_::MAGIC_ASSERT);
  _kjCondition_64._28_4_ = 1;
  DebugExpression<kj::Maybe<char>>::operator==
            ((DebugComparison<kj::Maybe<char>,_int> *)local_1858,
             (DebugExpression<kj::Maybe<char>> *)&local_185a,(int *)&_kjCondition_64.field_0x1c);
  DebugExpression<kj::Maybe<char>_>::~DebugExpression(&local_185a);
  Maybe<char>::~Maybe((Maybe<char> *)local_185c);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1858);
  if (!bVar1) {
    _kjCondition_64._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_64._27_1_ != '\0') {
      Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<char>() == 1\", _kjCondition",
                 (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<char>() == 1",
                 (DebugComparison<kj::Maybe<char>,_int> *)local_1858);
      _kjCondition_64._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<char>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<char>,_int> *)local_1858);
  operator____kj("1",1);
  StringPtr::tryParseAs<signed_char>((StringPtr *)local_189c);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_189a,(Maybe<signed_char> *)&_::MAGIC_ASSERT);
  _kjCondition_65._28_4_ = 1;
  DebugExpression<kj::Maybe<signed_char>>::operator==
            ((DebugComparison<kj::Maybe<signed_char>,_int> *)local_1898,
             (DebugExpression<kj::Maybe<signed_char>> *)&local_189a,
             (int *)&_kjCondition_65.field_0x1c);
  DebugExpression<kj::Maybe<signed_char>_>::~DebugExpression(&local_189a);
  Maybe<signed_char>::~Maybe((Maybe<signed_char> *)local_189c);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1898);
  if (!bVar1) {
    _kjCondition_65._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_65._27_1_ != '\0') {
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<signed char>() == 1\", _kjCondition"
                 ,(char (*) [55])"failed: expected \"1\"_kj.tryParseAs<signed char>() == 1",
                 (DebugComparison<kj::Maybe<signed_char>,_int> *)local_1898);
      _kjCondition_65._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<signed_char>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<signed_char>,_int> *)local_1898);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_18dc);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_18da,(Maybe<unsigned_char> *)&_::MAGIC_ASSERT);
  _kjCondition_66._28_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_char>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_char>,_int> *)local_18d8,
             (DebugExpression<kj::Maybe<unsigned_char>> *)&local_18da,
             (int *)&_kjCondition_66.field_0x1c);
  DebugExpression<kj::Maybe<unsigned_char>_>::~DebugExpression(&local_18da);
  Maybe<unsigned_char>::~Maybe((Maybe<unsigned_char> *)local_18dc);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_18d8);
  if (!bVar1) {
    _kjCondition_66._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_66._27_1_ != '\0') {
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned char>() == 1\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned char>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_char>,_int> *)local_18d8);
      _kjCondition_66._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_char>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_char>,_int> *)local_18d8);
  operator____kj("1",1);
  StringPtr::tryParseAs<short>((StringPtr *)local_1920);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_191c,(Maybe<short> *)&_::MAGIC_ASSERT);
  _kjCondition_67._28_4_ = 1;
  DebugExpression<kj::Maybe<short>>::operator==
            ((DebugComparison<kj::Maybe<short>,_int> *)local_1918,
             (DebugExpression<kj::Maybe<short>> *)&local_191c,(int *)&_kjCondition_67.field_0x1c);
  DebugExpression<kj::Maybe<short>_>::~DebugExpression(&local_191c);
  Maybe<short>::~Maybe((Maybe<short> *)local_1920);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1918);
  if (!bVar1) {
    _kjCondition_67._27_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_67._27_1_ != '\0') {
      Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<short>() == 1\", _kjCondition",
                 (char (*) [49])"failed: expected \"1\"_kj.tryParseAs<short>() == 1",
                 (DebugComparison<kj::Maybe<short>,_int> *)local_1918);
      _kjCondition_67._27_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<short>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<short>,_int> *)local_1918);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_1960);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_195c,(Maybe<unsigned_short> *)&_::MAGIC_ASSERT);
  _kjCondition_68._36_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_short>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_short>,_int> *)local_1958,
             (DebugExpression<kj::Maybe<unsigned_short>> *)&local_195c,
             (int *)&_kjCondition_68.field_0x24);
  DebugExpression<kj::Maybe<unsigned_short>_>::~DebugExpression(&local_195c);
  Maybe<unsigned_short>::~Maybe((Maybe<unsigned_short> *)local_1960);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1958);
  if (!bVar1) {
    _kjCondition_68._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_68._35_1_ != '\0') {
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned short>() == 1\", _kjCondition"
                 ,(char (*) [58])"failed: expected \"1\"_kj.tryParseAs<unsigned short>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_short>,_int> *)local_1958);
      _kjCondition_68._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_short>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_short>,_int> *)local_1958);
  operator____kj("1",1);
  StringPtr::tryParseAs<int>((StringPtr *)local_19b0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_19a8,(Maybe<int> *)&_::MAGIC_ASSERT);
  _kjCondition_69._36_4_ = 1;
  DebugExpression<kj::Maybe<int>>::operator==
            ((DebugComparison<kj::Maybe<int>,_int> *)local_19a0,
             (DebugExpression<kj::Maybe<int>> *)&local_19a8,(int *)&_kjCondition_69.field_0x24);
  DebugExpression<kj::Maybe<int>_>::~DebugExpression(&local_19a8);
  Maybe<int>::~Maybe((Maybe<int> *)local_19b0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_19a0);
  if (!bVar1) {
    _kjCondition_69._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_69._35_1_ != '\0') {
      Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf3,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int>() == 1\", _kjCondition",
                 (char (*) [47])"failed: expected \"1\"_kj.tryParseAs<int>() == 1",
                 (DebugComparison<kj::Maybe<int>,_int> *)local_19a0);
      _kjCondition_69._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<int>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<int>,_int> *)local_19a0);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_1a00);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_19f8,(Maybe<unsigned_int> *)&_::MAGIC_ASSERT);
  _kjCondition_70._44_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_int>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_int>,_int> *)local_19f0,
             (DebugExpression<kj::Maybe<unsigned_int>> *)&local_19f8,
             (int *)&_kjCondition_70.field_0x2c);
  DebugExpression<kj::Maybe<unsigned_int>_>::~DebugExpression(&local_19f8);
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_1a00);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_19f0);
  if (!bVar1) {
    _kjCondition_70._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_70._43_1_ != '\0') {
      Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned>() == 1\", _kjCondition",
                 (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<unsigned>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_int>,_int> *)local_19f0);
      _kjCondition_70._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_int>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_int>,_int> *)local_19f0);
  operator____kj("1",1);
  StringPtr::tryParseAs<long>(&local_1a68);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1a58,(Maybe<long> *)&_::MAGIC_ASSERT);
  _kjCondition_71._44_4_ = 1;
  DebugExpression<kj::Maybe<long>>::operator==
            ((DebugComparison<kj::Maybe<long>,_int> *)local_1a48,
             (DebugExpression<kj::Maybe<long>> *)&local_1a58,(int *)&_kjCondition_71.field_0x2c);
  DebugExpression<kj::Maybe<long>_>::~DebugExpression(&local_1a58);
  Maybe<long>::~Maybe((Maybe<long> *)&local_1a68);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a48);
  if (!bVar1) {
    _kjCondition_71._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_71._43_1_ != '\0') {
      Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long>() == 1\", _kjCondition",
                 (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<long>() == 1",
                 (DebugComparison<kj::Maybe<long>,_int> *)local_1a48);
      _kjCondition_71._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long>,_int> *)local_1a48);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_long>(&local_1ad0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1ac0,(Maybe<unsigned_long> *)&_::MAGIC_ASSERT);
  _kjCondition_72._44_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_1ab0,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_1ac0,
             (int *)&_kjCondition_72.field_0x2c);
  DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_1ac0);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_1ad0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1ab0);
  if (!bVar1) {
    _kjCondition_72._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_72._43_1_ != '\0') {
      Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long>() == 1\", _kjCondition"
                 ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned long>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_1ab0);
      _kjCondition_72._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long>,_int> *)local_1ab0);
  operator____kj("1",1);
  StringPtr::tryParseAs<long_long>(&local_1b38);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1b28,(Maybe<long_long> *)&_::MAGIC_ASSERT);
  _kjCondition_73._44_4_ = 1;
  DebugExpression<kj::Maybe<long_long>>::operator==
            ((DebugComparison<kj::Maybe<long_long>,_int> *)local_1b18,
             (DebugExpression<kj::Maybe<long_long>> *)&local_1b28,(int *)&_kjCondition_73.field_0x2c
            );
  DebugExpression<kj::Maybe<long_long>_>::~DebugExpression(&local_1b28);
  Maybe<long_long>::~Maybe((Maybe<long_long> *)&local_1b38);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b18);
  if (!bVar1) {
    _kjCondition_73._43_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_73._43_1_ != '\0') {
      Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<long_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf7,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long long>() == 1\", _kjCondition"
                 ,(char (*) [53])"failed: expected \"1\"_kj.tryParseAs<long long>() == 1",
                 (DebugComparison<kj::Maybe<long_long>,_int> *)local_1b18);
      _kjCondition_73._43_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<long_long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<long_long>,_int> *)local_1b18);
  operator____kj("1",1);
  StringPtr::tryParseAs<unsigned_long_long>(&local_1ba0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1b90,(Maybe<unsigned_long_long> *)&_::MAGIC_ASSERT);
  _kjCondition_74._36_4_ = 1;
  DebugExpression<kj::Maybe<unsigned_long_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long_long>,_int> *)local_1b80,
             (DebugExpression<kj::Maybe<unsigned_long_long>> *)&local_1b90,
             (int *)&_kjCondition_74.field_0x24);
  DebugExpression<kj::Maybe<unsigned_long_long>_>::~DebugExpression(&local_1b90);
  Maybe<unsigned_long_long>::~Maybe((Maybe<unsigned_long_long> *)&local_1ba0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b80);
  if (!bVar1) {
    _kjCondition_74._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_74._35_1_ != '\0') {
      Debug::log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<unsigned_long_long>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xf8,ERROR,
                 "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long long>() == 1\", _kjCondition"
                 ,(char (*) [62])"failed: expected \"1\"_kj.tryParseAs<unsigned long long>() == 1",
                 (DebugComparison<kj::Maybe<unsigned_long_long>,_int> *)local_1b80);
      _kjCondition_74._35_1_ = 0;
    }
  }
  DebugComparison<kj::Maybe<unsigned_long_long>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<unsigned_long_long>,_int> *)local_1b80);
  heapString((String *)local_1c08,"1");
  String::tryParseAs<int>((String *)local_1bf0);
  DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_1be8,(Maybe<int> *)&_::MAGIC_ASSERT);
  local_1c0c = 1;
  DebugExpression<kj::Maybe<int>>::operator==
            ((DebugComparison<kj::Maybe<int>,_int> *)local_1be0,
             (DebugExpression<kj::Maybe<int>> *)&local_1be8,&local_1c0c);
  DebugExpression<kj::Maybe<int>_>::~DebugExpression(&local_1be8);
  Maybe<int>::~Maybe((Maybe<int> *)local_1bf0);
  String::~String((String *)local_1c08);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1be0);
  if (!bVar1) {
    local_1c0d = Debug::shouldLog(ERROR);
    while (local_1c0d != false) {
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<int>,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xfa,ERROR,
                 "\"failed: expected \" \"heapString(\\\"1\\\").tryParseAs<int>() == 1\", _kjCondition"
                 ,(char (*) [56])"failed: expected heapString(\"1\").tryParseAs<int>() == 1",
                 (DebugComparison<kj::Maybe<int>,_int> *)local_1be0);
      local_1c0d = false;
    }
  }
  DebugComparison<kj::Maybe<int>,_int>::~DebugComparison
            ((DebugComparison<kj::Maybe<int>,_int> *)local_1be0);
  return;
}

Assistant:

TEST(String, tryParseAs) {
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0.0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("1"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1.0"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1e100"_kj.tryParseAs<double>() == 1e100);
  KJ_EXPECT("inf"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("infinity"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INF"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INFINITY"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("1e100000"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("-inf"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-infinity"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INF"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INFINITY"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-1e100000"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT(isNaN("nan"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NAN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NaN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(""_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<double>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<float>() == 1.0);

  KJ_EXPECT("1"_kj.tryParseAs<int64_t>() == 1);
  KJ_EXPECT("9223372036854775807"_kj.tryParseAs<int64_t>() == 9223372036854775807LL);
  KJ_EXPECT("-9223372036854775808"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL);
  KJ_EXPECT("9223372036854775808"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("-9223372036854775809"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0x10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("0X10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("-010"_kj.tryParseAs<int64_t>() == -10);
  KJ_EXPECT("-0x10"_kj.tryParseAs<int64_t>() == -16);
  KJ_EXPECT("-0X10"_kj.tryParseAs<int64_t>() == -16);

  KJ_EXPECT("1"_kj.tryParseAs<uint64_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint64_t>() == 0);
  KJ_EXPECT("18446744073709551615"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL);
  KJ_EXPECT("-1"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("18446744073709551616"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<uint64_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int32_t>() == 1);
  KJ_EXPECT("2147483647"_kj.tryParseAs<int32_t>() == 2147483647);
  KJ_EXPECT("-2147483648"_kj.tryParseAs<int32_t>() == -2147483648);
  KJ_EXPECT("2147483648"_kj.tryParseAs<int32_t>() == kj::none);
  KJ_EXPECT("-2147483649"_kj.tryParseAs<int32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<uint32_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint32_t>() == 0U);
  KJ_EXPECT("4294967295"_kj.tryParseAs<uint32_t>() == 4294967295U);
  KJ_EXPECT("-1"_kj.tryParseAs<uint32_t>() == kj::none);
  KJ_EXPECT("4294967296"_kj.tryParseAs<uint32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<signed char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long long>() == 1);

  KJ_EXPECT(heapString("1").tryParseAs<int>() == 1);
}